

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
add_file::perform(add_file *this,filesystemcollection *fslist,readercollection *rdlist)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  FileReader *__p;
  element_type *peVar6;
  shared_ptr<ReadWriter> local_68;
  undefined1 local_50 [8];
  ReadWriter_ptr r;
  undefined1 local_30 [8];
  FileContainer_ptr fs;
  readercollection *rdlist_local;
  filesystemcollection *fslist_local;
  add_file *this_local;
  
  fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rdlist;
  if (1 < g_verbose) {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    printf("adding %s:%s from %s\n",uVar2,uVar3,uVar4);
  }
  filesystemcollection::getbyname((filesystemcollection *)local_30,(string *)fslist);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (!bVar1) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "add: invalid fsname";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  __p = (FileReader *)operator_new(0x40);
  FileReader::FileReader(__p,&this->_srcpath);
  std::shared_ptr<ReadWriter>::shared_ptr<FileReader,void>((shared_ptr<ReadWriter> *)local_50,__p);
  peVar6 = std::__shared_ptr_access<FileContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FileContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::shared_ptr<ReadWriter>::shared_ptr(&local_68,(shared_ptr<ReadWriter> *)local_50);
  (*peVar6->_vptr_FileContainer[2])(peVar6,&this->_romname,&local_68);
  std::shared_ptr<ReadWriter>::~shared_ptr(&local_68);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_50);
  std::shared_ptr<FileContainer>::~shared_ptr((shared_ptr<FileContainer> *)local_30);
  return;
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose > 1)
            printf("adding %s:%s from %s\n", _fsname.c_str(), _romname.c_str(), _srcpath.c_str());
        FileContainer_ptr fs= fslist.getbyname(_fsname);
        if (!fs) throw "add: invalid fsname";

        ReadWriter_ptr r(new FileReader(_srcpath, FileReader::readonly));
        fs->addfile(_romname, r);
    }